

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O1

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::read<psql::authentication_request>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *this,authentication_request *msg,bytestring *buffer)

{
  pointer puVar1;
  runtime_error *prVar2;
  size_t in_RCX;
  long lVar3;
  error_code eVar4;
  uint8_t msg_type;
  deserialization_context ctx;
  char local_59;
  deserialization_context local_58;
  undefined8 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_59 = '\0';
  read(this,(int)buffer,&local_59,in_RCX);
  if (local_59 != 'R') {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Unexpected msg type");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  local_58.first_ = (pointer)0x0;
  if (lVar3 != 0) {
    local_58.first_ = puVar1;
  }
  local_58.last_ = local_58.first_ + lVar3;
  if (-1 < lVar3) {
    eVar4 = deserialize_message<psql::authentication_request>(msg,&local_58);
    local_48 = &local_38;
    uStack_30 = 0;
    uStack_40 = 0;
    local_38 = 0;
    if ((eVar4._0_8_ >> 0x20 & 1) == 0) {
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x40);
    std::runtime_error::runtime_error(prVar2,(string *)&local_48);
    *(undefined ***)prVar2 = &PTR__system_error_0011a088;
    *(error_code *)(prVar2 + 0x10) = eVar4;
    *(runtime_error **)(prVar2 + 0x20) = prVar2 + 0x30;
    *(undefined8 *)(prVar2 + 0x28) = 0;
    prVar2[0x30] = (runtime_error)0x0;
    __cxa_throw(prVar2,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  __assert_fail("last_ >= first_",
                "/workspace/llm4binary/github/license_c_cmakelists/anarthal[P]postgres-asio/include/psql/serialization_ctx.h"
                ,0x13,
                "psql::deserialization_context::deserialization_context(const std::uint8_t *, const std::uint8_t *)"
               );
}

Assistant:

void read(Message& msg, bytestring& buffer)
	{
		std::uint8_t msg_type = 0;
		read(buffer, msg_type);
		if (msg_type != Message::message_type) throw std::runtime_error("Unexpected msg type");
		deserialization_context ctx (boost::asio::buffer(buffer));
		auto err = deserialize_message(msg, ctx);
		check_error_code(err, error_info());
	}